

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::BlockThread
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,DWORD dwTimeout,bool fAlertable,
          bool fIsSleep,ThreadWakeupReason *ptwrWakeupReason,DWORD *pdwSignaledObject)

{
  bool bVar1;
  FILE *__stream;
  uint uVar2;
  ThreadWaitInfo *ptwiWaitInfo_00;
  bool bVar3;
  ThreadWaitInfo *ptwiWaitInfo;
  DWORD dwOldWaitState;
  bool fEarlyDeath;
  uint uStack_3c;
  bool fRaceAlerted;
  DWORD dwSigObjIdx;
  DWORD dwWaitState;
  DWORD *pdwWaitState;
  ThreadWakeupReason twrWakeupReason;
  PAL_ERROR palErr;
  ThreadWakeupReason *ptwrWakeupReason_local;
  bool fIsSleep_local;
  bool fAlertable_local;
  CPalThread *pCStack_18;
  DWORD dwTimeout_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pdwWaitState._4_4_ = 0;
  pdwWaitState._0_4_ = WaitFailed;
  uStack_3c = 0;
  dwOldWaitState = 0;
  bVar3 = false;
  bVar1 = false;
  _twrWakeupReason = ptwrWakeupReason;
  ptwrWakeupReason_local._2_1_ = fIsSleep;
  ptwrWakeupReason_local._3_1_ = fAlertable;
  ptwrWakeupReason_local._4_4_ = dwTimeout;
  pCStack_18 = pthrCurrent;
  pthrCurrent_local = (CPalThread *)this;
  _dwSigObjIdx = (uint *)SHMPtrToPtr((pthrCurrent->synchronizationInfo).m_shridWaitAwakened);
  if (_dwSigObjIdx == (uint *)0x0) {
    fprintf(_stderr,"] %s %s:%d","BlockThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xba);
    fprintf(_stderr,
            "Expression: NULL != pdwWaitState, Description: Got NULL pdwWaitState from m_shridWaitAwakened=%p\n"
            ,(pCStack_18->synchronizationInfo).m_shridWaitAwakened);
  }
  if ((ptwrWakeupReason_local._2_1_ & 1) != 0) {
    if ((ptwrWakeupReason_local._3_1_ & 1) != 0) {
      AcquireLocalSynchLock(pCStack_18);
      AcquireSharedSynchLock(pCStack_18);
      uVar2 = (*(this->super_IPalSynchronizationManager)._vptr_IPalSynchronizationManager[3])();
      bVar3 = (uVar2 & 1) != 0;
    }
    if (!bVar3) {
      uStack_3c = 1;
      if ((ptwrWakeupReason_local._3_1_ & 1) != 0) {
        uStack_3c = 2;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      uStack_3c = InterlockedCompareExchange((LONG *)_dwSigObjIdx,uStack_3c,0);
      if (uStack_3c != 0) {
        if ((ptwrWakeupReason_local._3_1_ & 1) != 0) {
          ReleaseSharedSynchLock(pCStack_18);
          ReleaseLocalSynchLock(pCStack_18);
        }
        if (uStack_3c == 3) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          bVar1 = true;
          pdwWaitState._4_4_ = 0xffffffff;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","BlockThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xfa);
          fprintf(_stderr,"Unexpected thread wait state %u\n",(ulong)uStack_3c);
          pdwWaitState._4_4_ = 0x54f;
        }
        goto LAB_003c0317;
      }
    }
    if ((ptwrWakeupReason_local._3_1_ & 1) != 0) {
      ReleaseSharedSynchLock(pCStack_18);
      ReleaseLocalSynchLock(pCStack_18);
    }
  }
  if (bVar3) {
    pdwWaitState._0_4_ = Alerted;
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pdwWaitState._4_4_ =
         ThreadNativeWait(&(pCStack_18->synchronizationInfo).m_tnwdNativeData,
                          ptwrWakeupReason_local._4_4_,(ThreadWakeupReason *)&pdwWaitState,
                          &dwOldWaitState);
    if (pdwWaitState._4_4_ != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pdwWaitState._0_4_ = WaitFailed;
      goto LAB_003c0317;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  if ((ThreadWakeupReason)pdwWaitState == WaitTimeout) {
    uStack_3c = 1;
    if ((ptwrWakeupReason_local._3_1_ & 1) != 0) {
      uStack_3c = 2;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    uVar2 = InterlockedCompareExchange((LONG *)_dwSigObjIdx,0,uStack_3c);
    if (uVar2 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pdwWaitState._4_4_ =
           ThreadNativeWait(&(pCStack_18->synchronizationInfo).m_tnwdNativeData,0xffffffff,
                            (ThreadWakeupReason *)&pdwWaitState,&dwOldWaitState);
      if (pdwWaitState._4_4_ != 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pdwWaitState._0_4_ = WaitFailed;
      }
      if (((ThreadWakeupReason)pdwWaitState == WaitTimeout) &&
         ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
    }
    else if ((uVar2 - 1 < 2) || (uVar2 != 3)) {
      if (uVar2 != uStack_3c) {
        fprintf(_stderr,"] %s %s:%d","BlockThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x164);
        fprintf(_stderr,
                "Expression: dwOldWaitState == dwWaitState, Description: Unexpected wait status: actual=%u, expected=%u\n"
                ,(ulong)uVar2);
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      bVar1 = true;
      pdwWaitState._4_4_ = 0xffffffff;
    }
  }
  if (((ThreadWakeupReason)pdwWaitState == WaitSucceeded) ||
     ((ThreadWakeupReason)pdwWaitState == MutexAbondoned)) {
    *pdwSignaledObject = dwOldWaitState;
  }
  else if ((ThreadWakeupReason)pdwWaitState == WaitTimeout) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    AcquireLocalSynchLock(pCStack_18);
    ptwiWaitInfo_00 = GetThreadWaitInfo(pCStack_18);
    UnRegisterWait(this,pCStack_18,ptwiWaitInfo_00,false);
    ReleaseLocalSynchLock(pCStack_18);
  }
  *_twrWakeupReason = (ThreadWakeupReason)pdwWaitState;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  uVar2 = VolatileLoad<unsigned_int>(_dwSigObjIdx);
  if ((uVar2 != 0) && (uVar2 = VolatileLoad<unsigned_int>(_dwSigObjIdx), uVar2 != 3)) {
    fprintf(_stderr,"] %s %s:%d","BlockThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x193);
    __stream = _stderr;
    uVar2 = VolatileLoad<unsigned_int>(_dwSigObjIdx);
    fprintf(__stream,
            "Expression: TWS_ACTIVE == VolatileLoad(pdwWaitState) || TWS_EARLYDEATH == VolatileLoad(pdwWaitState), Description: Unexpected thread wait state %u\n"
            ,(ulong)uVar2);
  }
LAB_003c0317:
  if (bVar1) {
    ThreadPrepareForShutdown();
  }
  return pdwWaitState._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::BlockThread(
        CPalThread *pthrCurrent,
        DWORD dwTimeout,
        bool fAlertable,
        bool fIsSleep,
        ThreadWakeupReason *ptwrWakeupReason,
        DWORD * pdwSignaledObject)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadWakeupReason twrWakeupReason = WaitFailed;
        DWORD * pdwWaitState;
        DWORD dwWaitState = 0;
        DWORD dwSigObjIdx = 0;
        bool fRaceAlerted = false;
        bool fEarlyDeath = false;

        pdwWaitState = SharedIDToTypePointer(DWORD,
                pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        _ASSERT_MSG(NULL != pdwWaitState,
                    "Got NULL pdwWaitState from m_shridWaitAwakened=%p\n",
                    (VOID *)pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        if (fIsSleep)
        {
            // If fIsSleep is true we are being called by Sleep/SleepEx
            // and we need to switch the wait state to TWS_WAITING or
            // TWS_ALERTABLE (according to fAlertable)

            if (fAlertable)
            {
                // If we are in alertable mode we need to grab the lock to
                // make sure that no APC is queued right before the
                // InterlockedCompareExchange.
                // If there are APCs queued at this time, no native wakeup
                // will be posted, so we need to skip the native wait

                // Lock
                AcquireLocalSynchLock(pthrCurrent);
                AcquireSharedSynchLock(pthrCurrent);

                if (AreAPCsPending(pthrCurrent))
                {
                    // APCs have been queued when the thread wait status was
                    // still TWS_ACTIVE, therefore the queueing thread will not
                    // post any native wakeup: we need to skip the actual
                    // native wait
                    fRaceAlerted = true;
                }
            }

            if (!fRaceAlerted)
            {
                // Setting the thread in wait state
                dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

                TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u "
                      "[current *pdwWaitState=%u]\n",
                      pdwWaitState, dwWaitState, *pdwWaitState);

                dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                         dwWaitState,
                                                         TWS_ACTIVE);

                if((DWORD)TWS_ACTIVE != dwWaitState)
                {
                    if (fAlertable)
                    {
                        // Unlock
                        ReleaseSharedSynchLock(pthrCurrent);
                        ReleaseLocalSynchLock(pthrCurrent);
                    }
                    if((DWORD)TWS_EARLYDEATH == dwWaitState)
                    {
                        // Process is terminating, this thread will soon be
                        // suspended (by SuspendOtherThreads).
                        WARN("Thread is about to get suspended by "
                             "TerminateProcess\n");

                        fEarlyDeath = true;
                        palErr = WAIT_FAILED;
                    }
                    else
                    {
                        ASSERT("Unexpected thread wait state %u\n",
                               dwWaitState);
                        palErr = ERROR_INTERNAL_ERROR;
                    }
                    goto BT_exit;
                }
            }

            if (fAlertable)
            {
                // Unlock
                ReleaseSharedSynchLock(pthrCurrent);
                ReleaseLocalSynchLock(pthrCurrent);
            }
        }

        if (fRaceAlerted)
        {
            twrWakeupReason = Alerted;
        }
        else
        {
            TRACE("Current thread is about to block for waiting\n");

            palErr = ThreadNativeWait(
                &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                dwTimeout,
                &twrWakeupReason,
                &dwSigObjIdx);

            if (NO_ERROR != palErr)
            {
                ERROR("ThreadNativeWait() failed [palErr=%d]\n", palErr);
                twrWakeupReason = WaitFailed;
                goto BT_exit;
            }

            TRACE("ThreadNativeWait returned {WakeupReason=%u "
                  "dwSigObjIdx=%u}\n", twrWakeupReason, dwSigObjIdx);
        }

        if (WaitTimeout == twrWakeupReason)
        {
            // timeout reached. set wait state back to 'active'
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

            TRACE("Current thread awakened for timeout: switching wait "
                  "state [%p] from %u to TWS_ACTIVE [current *pdwWaitState=%u]\n",
                   pdwWaitState, dwWaitState, *pdwWaitState);

            DWORD dwOldWaitState = InterlockedCompareExchange(
                                        (LONG *)pdwWaitState,
                                        TWS_ACTIVE, (LONG)dwWaitState);

            switch (dwOldWaitState)
            {
                case TWS_ACTIVE:
                    // We were already ACTIVE; someone decided to wake up this
                    // thread sometime between the moment the native wait
                    // timed out and here. Since the signaling side succeeded
                    // its InterlockedCompareExchange, it will signal the
                    // condition/predicate pair (we just raced overtaking it);
                    // therefore we need to clear the condition/predicate
                    // by waiting on it one more time.
                    // That will also cause this method to report a signal
                    // rather than a timeout.
                    // In the remote signaling scenario, this second wait
                    // also makes sure that the shared id passed over the
                    // process pipe is valid for the entire duration of time
                    // in which the worker thread deals with it
                    TRACE("Current thread already ACTIVE: a signaling raced "
                          "with the timeout: re-waiting natively to clear the "
                          "predicate\n");

                    palErr = ThreadNativeWait(
                        &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                        SecondNativeWaitTimeout,
                        &twrWakeupReason,
                        &dwSigObjIdx);

                    if (NO_ERROR != palErr)
                    {
                        ERROR("ThreadNativeWait() failed [palErr=%d]\n",
                              palErr);
                        twrWakeupReason = WaitFailed;
                    }
                    if (WaitTimeout == twrWakeupReason)
                    {
                        ERROR("Second native wait timed out\n");
                    }
                    break;
                case TWS_EARLYDEATH:
                    // Thread is about to be suspended by TerminateProcess.
                    // Anyway, if the wait timed out, we still want to
                    // (try to) unregister the wait (especially if it
                    // involves shared objects)
                    WARN("Thread is about to be suspended by "
                         "TerminateProcess\n");
                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                    break;
                case TWS_WAITING:
                case TWS_ALERTABLE:
                default:
                    _ASSERT_MSG(dwOldWaitState == dwWaitState,
                                "Unexpected wait status: actual=%u, "
                                "expected=%u\n",
                               dwOldWaitState, dwWaitState);
                    break;
            }
        }

        switch (twrWakeupReason)
        {
            case WaitTimeout:
            {
                // Awakened for timeout: we need to unregister the wait
                ThreadWaitInfo * ptwiWaitInfo;

                TRACE("Current thread awakened for timeout: "
                            "unregistering the wait\n");

                // Local lock
                AcquireLocalSynchLock(pthrCurrent);

                ptwiWaitInfo = GetThreadWaitInfo(pthrCurrent);

                // Unregister the wait
                // Note: UnRegisterWait will take care of grabbing the shared
                //       synch lock, if needed.
                UnRegisterWait(pthrCurrent, ptwiWaitInfo, false);

                // Unlock
                ReleaseLocalSynchLock(pthrCurrent);

                break;
            }
            case WaitSucceeded:
            case MutexAbondoned:
                *pdwSignaledObject = dwSigObjIdx;
                break;
            default:
                // 'Alerted' and 'WaitFailed' go through this case
                break;
        }

        // Set the returned wakeup reason
        *ptwrWakeupReason = twrWakeupReason;

        TRACE("Current thread is now active [WakeupReason=%u SigObjIdx=%u]\n",
              twrWakeupReason, dwSigObjIdx);

        _ASSERT_MSG(TWS_ACTIVE == VolatileLoad(pdwWaitState) ||
                    TWS_EARLYDEATH == VolatileLoad(pdwWaitState),
                    "Unexpected thread wait state %u\n", VolatileLoad(pdwWaitState));

    BT_exit:
        if (fEarlyDeath)
        {
            ThreadPrepareForShutdown();
        }
        return palErr;
    }